

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

liu * __thiscall liu::sigmoid(liu *this,Mat *x)

{
  Mat exp_x;
  _InputArray local_368;
  undefined8 uStack_350;
  Mat local_340 [96];
  long *local_2e0 [2];
  Mat local_2d0 [96];
  Mat local_270 [96];
  Mat local_210 [144];
  undefined1 local_180 [112];
  Mat local_110 [96];
  Mat aMStack_b0 [144];
  
  cv::Mat::Mat(local_340);
  cv::Mat::Mat((Mat *)this);
  cv::operator-((cv *)local_2e0,x);
  cv::_InputArray::_InputArray((_InputArray *)local_180,(MatExpr *)local_2e0);
  local_368.sz.width = 0;
  local_368.sz.height = 0;
  local_368.flags = 0x2010000;
  local_368.obj = local_340;
  cv::exp((_InputArray *)local_180,(_OutputArray *)&local_368);
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat(local_2d0);
  local_368.flags = 0;
  local_368._4_4_ = 0x3ff00000;
  local_368.obj = (void *)0x0;
  local_368.sz.width = 0;
  local_368.sz.height = 0;
  uStack_350 = 0;
  cv::operator+((Scalar_ *)local_180,(Mat *)&local_368);
  cv::operator/(1.0,(MatExpr *)local_2e0);
  (**(code **)(*local_2e0[0] + 0x18))(local_2e0[0],local_2e0,this,0xffffffff);
  cv::Mat::~Mat(local_210);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat(local_2d0);
  cv::Mat::~Mat(aMStack_b0);
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat((Mat *)(local_180 + 0x10));
  cv::Mat::~Mat(local_340);
  return this;
}

Assistant:

cv::Mat sigmoid(cv::Mat &x)
	{
		cv::Mat exp_x, fx;
		cv::exp(-x, exp_x);
		fx = 1.0 / (1.0 + exp_x);
		return fx;
	}